

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O1

Vec_Int_t * Abc_NtkDressMapClasses(Aig_Man_t *pMiter,Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  long lVar7;
  ulong uVar8;
  Aig_Obj_t *pAVar9;
  Aig_Obj_t *pAVar10;
  long lVar11;
  
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  pVVar5->nCap = 0;
  pVVar5->nSize = 0;
  pVVar5->pArray = (int *)0x0;
  pVVar2 = pNtk->vObjs;
  iVar1 = pVVar2->nSize;
  lVar11 = (long)iVar1;
  if (0 < lVar11) {
    piVar6 = (int *)malloc(lVar11 * 4);
    pVVar5->pArray = piVar6;
    if (piVar6 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    pVVar5->nCap = iVar1;
    if (0 < iVar1) {
      memset(pVVar5->pArray,0xff,lVar11 * 4);
    }
  }
  pVVar5->nSize = iVar1;
  if (0 < pVVar2->nSize) {
    ppvVar3 = pVVar2->pArray;
    lVar7 = 0;
    do {
      pvVar4 = ppvVar3[lVar7];
      if (((((pvVar4 != (void *)0x0) && ((*(uint *)((long)pvVar4 + 0x14) & 0xf) == 7)) &&
           (uVar8 = *(ulong *)((long)pvVar4 + 0x40) & 0xfffffffffffffffe, uVar8 != 0)) &&
          (((*(byte *)(uVar8 + 0x14) & 0xf) != 0 &&
           (uVar8 = *(ulong *)(uVar8 + 0x40) & 0xfffffffffffffffe, uVar8 != 0)))) &&
         (((*(byte *)(uVar8 + 0x18) & 7) != 0 &&
          ((pAVar9 = (Aig_Obj_t *)(*(ulong *)(uVar8 + 0x28) & 0xfffffffffffffffe),
           pAVar9 != (Aig_Obj_t *)0x0 && ((pAVar9->field_0x18 & 7) != 0)))))) {
        if (pMiter->pReprs == (Aig_Obj_t **)0x0) {
          pAVar10 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar10 = pMiter->pReprs[pAVar9->Id];
        }
        if (lVar11 <= lVar7) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        if (pAVar10 != (Aig_Obj_t *)0x0) {
          pAVar9 = pAVar10;
        }
        pVVar5->pArray[lVar7] = pAVar9->Id;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar2->nSize);
  }
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkDressMapClasses( Aig_Man_t * pMiter, Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vId2Lit;
    Abc_Obj_t * pObj, * pAnd;
    Aig_Obj_t * pObjMan, * pObjMiter, * pObjRepr;
    int i;
    vId2Lit = Vec_IntAlloc( 0 );
    Vec_IntFill( vId2Lit, Abc_NtkObjNumMax(pNtk), -1 );
    Abc_NtkForEachNode( pNtk, pObj, i )
    {
        // get the pointer to the miter node corresponding to pObj
        if ( (pAnd = Abc_ObjRegular(pObj->pCopy)) && Abc_ObjType(pAnd) != ABC_OBJ_NONE &&          // strashed node is present and legal
             (pObjMan = Aig_Regular((Aig_Obj_t *)pAnd->pCopy)) && Aig_ObjType(pObjMan) != AIG_OBJ_NONE &&       // AIG node is present and legal
             (pObjMiter = Aig_Regular((Aig_Obj_t *)pObjMan->pData)) && Aig_ObjType(pObjMiter) != AIG_OBJ_NONE ) // miter node is present and legal
        {
            // get the representative of the miter node
            pObjRepr = Aig_ObjRepr( pMiter, pObjMiter );
            pObjRepr = pObjRepr? pObjRepr : pObjMiter;
            // map pObj (whose ID is i) into the repr node ID (i.e. equiv class)
            Vec_IntWriteEntry( vId2Lit, i, Aig_ObjId(pObjRepr) );
        }
    }
    return vId2Lit;
}